

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O1

uint SOIL_direct_load_DDS_from_memory
               (uchar *buffer,int buffer_length,uint reuse_texture_ID,int flags,
               int loading_as_cubemap)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  long lVar5;
  ulong uVar6;
  void *__dest;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  GLenum GVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  uint tex_ID;
  int local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  undefined4 local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  undefined8 local_58;
  ulong local_50;
  GLenum local_44;
  ulong local_40;
  ulong local_38;
  
  tex_ID = 0;
  if (buffer == (uchar *)0x0) {
    result_string_pointer = "NULL buffer";
  }
  else if ((uint)buffer_length < 0x80) {
    result_string_pointer = "DDS file was too small to contain the DDS header";
  }
  else {
    local_70 = (ulong)*(uint *)(buffer + 0xc);
    local_68 = (ulong)*(uint *)(buffer + 0x10);
    uVar9 = *(uint *)(buffer + 0x1c);
    uVar8 = *(uint *)(buffer + 0x50);
    uVar12 = *(uint *)(buffer + 0x54);
    uVar2 = *(uint *)(buffer + 0x6c);
    uVar3 = *(uint *)(buffer + 0x70);
    result_string_pointer = "Failed to read a known DDS header";
    if (*(int *)buffer != 0x20534444) {
      return 0;
    }
    if (*(int *)(buffer + 4) != 0x7c) {
      return 0;
    }
    if ((*(uint *)(buffer + 8) & 0x1007) != 0x1007) {
      return 0;
    }
    if (((uVar2 >> 0xc & 1) == 0 || (uVar8 & 0x44) == 0) || *(int *)(buffer + 0x4c) != 0x20) {
      return 0;
    }
    local_88 = uVar8 & 4;
    if (((local_88 != 0) && (uVar12 != 0x35545844)) && ((uVar12 & 0xfdffffff) != 0x31545844)) {
      return 0;
    }
    result_string_pointer = "DDS header loaded and validated";
    local_50 = CONCAT44(local_50._4_4_,reuse_texture_ID);
    if (local_88 == 0) {
      local_90 = (uVar8 & 1) + 3;
      local_78 = (ulong)((uVar8 & 1) + 0x1907);
      uVar8 = *(uint *)(buffer + 0x10) * *(uint *)(buffer + 0xc) * local_90;
    }
    else {
      local_94 = buffer_length;
      local_8c = flags;
      iVar13 = query_DXT_capability();
      if (iVar13 != 1) {
        result_string_pointer = "Direct upload of S3TC images not supported by the OpenGL driver";
        return 0;
      }
      bVar16 = (char)(uVar12 >> 0x18) - 0x31;
      if (bVar16 < 5) {
        lVar5 = (ulong)bVar16 * 4;
        local_90 = *(uint *)(&DAT_002182e8 + lVar5);
        local_78 = (ulong)*(uint *)(&DAT_002182fc + lVar5);
      }
      else {
        local_78 = 0;
        local_90 = 0x10;
      }
      uVar8 = ((int)local_70 + 3U >> 2) * ((int)local_68 + 3U >> 2) * local_90;
      buffer_length = local_94;
      flags = local_8c;
    }
    local_80 = (ulong)uVar8;
    if ((uVar3 >> 9 & 1) == 0) {
      if (loading_as_cubemap == 0) {
        GVar11 = 0xde1;
        local_58 = 0xde1;
        local_84 = 0xde1;
LAB_001bf5fe:
        uVar17 = local_68;
        uVar15 = local_70;
        local_98 = 0;
        uVar8 = (uint)local_80;
        if (((1 < uVar9 & (byte)(uVar2 >> 0x16)) == 1) && (local_98 = uVar9 - 1, 0 < local_98)) {
          uVar9 = local_88 >> 1;
          uVar6 = local_80;
          iVar13 = local_98;
          do {
            uVar9 = uVar9 + 1;
            uVar8 = (uint)local_68 >> ((byte)uVar9 & 0x1f);
            uVar12 = (uint)local_70 >> ((byte)uVar9 & 0x1f);
            if ((int)uVar8 < 2) {
              uVar8 = 1;
            }
            if ((int)uVar12 < 2) {
              uVar12 = 1;
            }
            uVar8 = (int)uVar6 + uVar12 * local_90 * uVar8;
            uVar6 = (ulong)uVar8;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
        }
        local_40 = (ulong)uVar8;
        local_94 = buffer_length;
        local_8c = flags;
        __dest = malloc(local_40);
        tex_ID = (uint)local_50;
        if ((uint)local_50 == 0) {
          glGenTextures(1,&tex_ID);
        }
        glBindTexture(local_84,tex_ID);
        if (GVar11 <= (uint)local_58) {
          local_44 = (uint)local_58 + 1;
          local_38 = (ulong)local_90;
          local_50 = (ulong)(uint)-local_98;
          uVar9 = 0x80;
          do {
            uVar6 = local_40;
            uVar8 = uVar9 + (int)local_40;
            if (local_94 < uVar8) {
              glDeleteTextures(1,&tex_ID);
              tex_ID = 0;
              result_string_pointer = "DDS file was too small for expected image data";
              GVar11 = local_44;
            }
            else {
              local_5c = uVar8;
              memcpy(__dest,buffer + uVar9,local_40);
              if (local_88 == 0) {
                if (uVar6 != 0) {
                  uVar7 = 0;
                  do {
                    uVar1 = *(undefined1 *)((long)__dest + uVar7);
                    *(undefined1 *)((long)__dest + uVar7) =
                         *(undefined1 *)((long)__dest + uVar7 + 2);
                    *(undefined1 *)((long)__dest + uVar7 + 2) = uVar1;
                    uVar7 = uVar7 + local_38;
                  } while (uVar7 < uVar6);
                }
                glTexImage2D(GVar11,0,local_78,uVar17 & 0xffffffff,uVar15 & 0xffffffff,0,local_78,
                             0x1401,__dest);
              }
              else {
                (*soilGlCompressedTexImage2D)
                          (GVar11,0,(GLenum)local_78,(GLsizei)uVar17,(GLsizei)uVar15,0,
                           (GLsizei)local_80,__dest);
              }
              if (local_98 < 1) {
                result_string_pointer = "DDS file loaded";
                uVar9 = local_5c;
              }
              else {
                iVar13 = 1;
                uVar17 = local_80 & 0xffffffff;
                do {
                  uVar8 = (uint)local_68 >> ((byte)iVar13 & 0x1f);
                  uVar9 = (uint)uVar15 >> ((byte)iVar13 & 0x1f);
                  if ((int)uVar8 < 2) {
                    uVar8 = 1;
                  }
                  if ((int)uVar9 < 2) {
                    uVar9 = 1;
                  }
                  if (local_88 == 0) {
                    iVar14 = uVar9 * local_90 * uVar8;
                    glTexImage2D(GVar11,iVar13,local_78,uVar8,uVar9,0,local_78,0x1401,
                                 uVar17 + (long)__dest);
                  }
                  else {
                    iVar14 = (uVar9 + 3 >> 2) * local_90 * (uVar8 + 3 >> 2);
                    (*soilGlCompressedTexImage2D)
                              (GVar11,iVar13,(GLenum)local_78,uVar8,uVar9,0,iVar14,
                               (GLvoid *)(uVar17 + (long)__dest));
                  }
                  uVar17 = (ulong)(uint)((int)uVar17 + iVar14);
                  iVar14 = (int)local_50 + iVar13;
                  iVar13 = iVar13 + 1;
                  uVar15 = local_70;
                } while (iVar14 != 0);
                result_string_pointer = "DDS file loaded";
                uVar17 = local_68;
                uVar9 = local_5c;
              }
            }
            GVar11 = GVar11 + 1;
          } while (GVar11 <= (uint)local_58);
        }
        free(__dest);
        uVar4 = local_84;
        uVar9 = local_8c;
        if (tex_ID != 0) {
          glTexParameteri(local_84,0x2800,0x2601);
          uVar10 = 0x2703;
          if (local_98 < 1) {
            uVar10 = 0x2601;
          }
          glTexParameteri(uVar4,0x2801,uVar10);
          iVar13 = 0x2901 - (uint)((uVar9 & 4) == 0);
          glTexParameteri(uVar4,0x2802,iVar13);
          glTexParameteri(uVar4,0x2803,iVar13);
          glTexParameteri(uVar4,0x8072,iVar13);
          return tex_ID;
        }
        return 0;
      }
      result_string_pointer = "DDS image was not a cubemap";
    }
    else if (loading_as_cubemap == 0) {
      result_string_pointer = "DDS image was a cubemap";
    }
    else {
      iVar13 = query_cubemap_capability();
      if (iVar13 == 1) {
        local_84 = 0x8513;
        local_58 = 0x851a;
        GVar11 = 0x8515;
        goto LAB_001bf5fe;
      }
      result_string_pointer = "Direct upload of cubemap images not supported by the OpenGL driver";
    }
  }
  return 0;
}

Assistant:

unsigned int SOIL_direct_load_DDS_from_memory(
		const unsigned char *const buffer,
		int buffer_length,
		unsigned int reuse_texture_ID,
		int flags,
		int loading_as_cubemap )
{
	/*	variables	*/
	DDS_header header;
	unsigned int buffer_index = 0;
	unsigned int tex_ID = 0;
	/*	file reading variables	*/
	unsigned int S3TC_type = 0;
	unsigned char *DDS_data;
	unsigned int DDS_main_size;
	unsigned int DDS_full_size;
	unsigned int width, height;
	int mipmaps, cubemap, uncompressed, block_size = 16;
	unsigned int flag;
	unsigned int cf_target, ogl_target_start, ogl_target_end;
	unsigned int opengl_texture_type;
	int i;
	/*	1st off, does the filename even exist?	*/
	if( NULL == buffer )
	{
		/*	we can't do it!	*/
		result_string_pointer = "NULL buffer";
		return 0;
	}
	if( buffer_length < sizeof( DDS_header ) )
	{
		/*	we can't do it!	*/
		result_string_pointer = "DDS file was too small to contain the DDS header";
		return 0;
	}
	/*	try reading in the header	*/
	memcpy ( (void*)(&header), (const void *)buffer, sizeof( DDS_header ) );
	buffer_index = sizeof( DDS_header );
	/*	guilty until proven innocent	*/
	result_string_pointer = "Failed to read a known DDS header";
	/*	validate the header (warning, "goto"'s ahead, shield your eyes!!)	*/
	flag = ('D'<<0)|('D'<<8)|('S'<<16)|(' '<<24);
	if( header.dwMagic != flag ) {goto quick_exit;}
	if( header.dwSize != 124 ) {goto quick_exit;}
	/*	I need all of these	*/
	flag = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT;
	if( (header.dwFlags & flag) != flag ) {goto quick_exit;}
	/*	According to the MSDN spec, the dwFlags should contain
		DDSD_LINEARSIZE if it's compressed, or DDSD_PITCH if
		uncompressed.  Some DDS writers do not conform to the
		spec, so I need to make my reader more tolerant	*/
	/*	I need one of these	*/
	flag = DDPF_FOURCC | DDPF_RGB;
	if( (header.sPixelFormat.dwFlags & flag) == 0 ) {goto quick_exit;}
	if( header.sPixelFormat.dwSize != 32 ) {goto quick_exit;}
	if( (header.sCaps.dwCaps1 & DDSCAPS_TEXTURE) == 0 ) {goto quick_exit;}
	/*	make sure it is a type we can upload	*/
	if( (header.sPixelFormat.dwFlags & DDPF_FOURCC) &&
		!(
		(header.sPixelFormat.dwFourCC == (('D'<<0)|('X'<<8)|('T'<<16)|('1'<<24))) ||
		(header.sPixelFormat.dwFourCC == (('D'<<0)|('X'<<8)|('T'<<16)|('3'<<24))) ||
		(header.sPixelFormat.dwFourCC == (('D'<<0)|('X'<<8)|('T'<<16)|('5'<<24)))
		) )
	{
		goto quick_exit;
	}
	/*	OK, validated the header, let's load the image data	*/
	result_string_pointer = "DDS header loaded and validated";
	width = header.dwWidth;
	height = header.dwHeight;
	uncompressed = 1 - (header.sPixelFormat.dwFlags & DDPF_FOURCC) / DDPF_FOURCC;
	cubemap = (header.sCaps.dwCaps2 & DDSCAPS2_CUBEMAP) / DDSCAPS2_CUBEMAP;
	if( uncompressed )
	{
		S3TC_type = GL_RGB;
		block_size = 3;
		if( header.sPixelFormat.dwFlags & DDPF_ALPHAPIXELS )
		{
			S3TC_type = GL_RGBA;
			block_size = 4;
		}
		DDS_main_size = width * height * block_size;
	} else
	{
		/*	can we even handle direct uploading to OpenGL DXT compressed images?	*/
		if( query_DXT_capability() != SOIL_CAPABILITY_PRESENT )
		{
			/*	we can't do it!	*/
			result_string_pointer = "Direct upload of S3TC images not supported by the OpenGL driver";
			return 0;
		}
		/*	well, we know it is DXT1/3/5, because we checked above	*/
		switch( (header.sPixelFormat.dwFourCC >> 24) - '0' )
		{
		case 1:
			S3TC_type = SOIL_RGBA_S3TC_DXT1;
			block_size = 8;
			break;
		case 3:
			S3TC_type = SOIL_RGBA_S3TC_DXT3;
			block_size = 16;
			break;
		case 5:
			S3TC_type = SOIL_RGBA_S3TC_DXT5;
			block_size = 16;
			break;
		}
		DDS_main_size = ((width+3)>>2)*((height+3)>>2)*block_size;
	}
	if( cubemap )
	{
		/* does the user want a cubemap?	*/
		if( !loading_as_cubemap )
		{
			/*	we can't do it!	*/
			result_string_pointer = "DDS image was a cubemap";
			return 0;
		}
		/*	can we even handle cubemaps with the OpenGL driver?	*/
		if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
		{
			/*	we can't do it!	*/
			result_string_pointer = "Direct upload of cubemap images not supported by the OpenGL driver";
			return 0;
		}
		ogl_target_start = SOIL_TEXTURE_CUBE_MAP_POSITIVE_X;
		ogl_target_end =   SOIL_TEXTURE_CUBE_MAP_NEGATIVE_Z;
		opengl_texture_type = SOIL_TEXTURE_CUBE_MAP;
	} else
	{
		/* does the user want a non-cubemap?	*/
		if( loading_as_cubemap )
		{
			/*	we can't do it!	*/
			result_string_pointer = "DDS image was not a cubemap";
			return 0;
		}
		ogl_target_start = GL_TEXTURE_2D;
		ogl_target_end =   GL_TEXTURE_2D;
		opengl_texture_type = GL_TEXTURE_2D;
	}
	if( (header.sCaps.dwCaps1 & DDSCAPS_MIPMAP) && (header.dwMipMapCount > 1) )
	{
		int shift_offset;
		mipmaps = header.dwMipMapCount - 1;
		DDS_full_size = DDS_main_size;
		if( uncompressed )
		{
			/*	uncompressed DDS, simple MIPmap size calculation	*/
			shift_offset = 0;
		} else
		{
			/*	compressed DDS, MIPmap size calculation is block based	*/
			shift_offset = 2;
		}
		for( i = 1; i <= mipmaps; ++ i )
		{
			int w, h;
			w = width >> (shift_offset + i);
			h = height >> (shift_offset + i);
			if( w < 1 )
			{
				w = 1;
			}
			if( h < 1 )
			{
				h = 1;
			}
			DDS_full_size += w*h*block_size;
		}
	} else
	{
		mipmaps = 0;
		DDS_full_size = DDS_main_size;
	}
	DDS_data = (unsigned char*)malloc( DDS_full_size );
	/*	got the image data RAM, create or use an existing OpenGL texture handle	*/
	tex_ID = reuse_texture_ID;
	if( tex_ID == 0 )
	{
		glGenTextures( 1, &tex_ID );
	}
	/*  bind an OpenGL texture ID	*/
	glBindTexture( opengl_texture_type, tex_ID );
	/*	do this for each face of the cubemap!	*/
	for( cf_target = ogl_target_start; cf_target <= ogl_target_end; ++cf_target )
	{
		if( buffer_index + DDS_full_size <= buffer_length )
		{
			unsigned int byte_offset = DDS_main_size;
			memcpy( (void*)DDS_data, (const void*)(&buffer[buffer_index]), DDS_full_size );
			buffer_index += DDS_full_size;
			/*	upload the main chunk	*/
			if( uncompressed )
			{
				/*	and remember, DXT uncompressed uses BGR(A),
					so swap to RGB(A) for ALL MIPmap levels	*/
				for( i = 0; i < DDS_full_size; i += block_size )
				{
					unsigned char temp = DDS_data[i];
					DDS_data[i] = DDS_data[i+2];
					DDS_data[i+2] = temp;
				}
				glTexImage2D(
					cf_target, 0,
					S3TC_type, width, height, 0,
					S3TC_type, GL_UNSIGNED_BYTE, DDS_data );
			} else
			{
				soilGlCompressedTexImage2D(
					cf_target, 0,
					S3TC_type, width, height, 0,
					DDS_main_size, DDS_data );
			}
			/*	upload the mipmaps, if we have them	*/
			for( i = 1; i <= mipmaps; ++i )
			{
				int w, h, mip_size;
				w = width >> i;
				h = height >> i;
				if( w < 1 )
				{
					w = 1;
				}
				if( h < 1 )
				{
					h = 1;
				}
				/*	upload this mipmap	*/
				if( uncompressed )
				{
					mip_size = w*h*block_size;
					glTexImage2D(
						cf_target, i,
						S3TC_type, w, h, 0,
						S3TC_type, GL_UNSIGNED_BYTE, &DDS_data[byte_offset] );
				} else
				{
					mip_size = ((w+3)/4)*((h+3)/4)*block_size;
					soilGlCompressedTexImage2D(
						cf_target, i,
						S3TC_type, w, h, 0,
						mip_size, &DDS_data[byte_offset] );
				}
				/*	and move to the next mipmap	*/
				byte_offset += mip_size;
			}
			/*	it worked!	*/
			result_string_pointer = "DDS file loaded";
		} else
		{
			glDeleteTextures( 1, & tex_ID );
			tex_ID = 0;
			cf_target = ogl_target_end + 1;
			result_string_pointer = "DDS file was too small for expected image data";
		}
	}/* end reading each face */
	SOIL_free_image_data( DDS_data );
	if( tex_ID )
	{
		/*	did I have MIPmaps?	*/
		if( mipmaps > 0 )
		{
			/*	instruct OpenGL to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR );
		} else
		{
			/*	instruct OpenGL _NOT_ to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR );
		}
		/*	does the user want clamping, or wrapping?	*/
		if( flags & SOIL_FLAG_TEXTURE_REPEATS )
		{
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, GL_REPEAT );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, GL_REPEAT );
			glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, GL_REPEAT );
		} else
		{
			/*	unsigned int clamp_mode = SOIL_CLAMP_TO_EDGE;	*/
			unsigned int clamp_mode = GL_CLAMP;
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, clamp_mode );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, clamp_mode );
			glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, clamp_mode );
		}
	}

quick_exit:
	/*	report success or failure	*/
	return tex_ID;
}